

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  _List_node_base *this_00;
  pthread_mutex_t *__mutex;
  _List_node_base *p_Var1;
  PoolAllocatorPrivate *pPVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  value_type local_30;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  __mutex = (pthread_mutex_t *)this->d;
  this_00 = (_List_node_base *)((long)__mutex + 0x58);
  __position._M_node = this_00;
  do {
    __position._M_node =
         (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            *)&(__position._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (__position._M_node == this_00) {
      pthread_mutex_unlock(__mutex);
      p_Var3 = (_List_node_base *)ncnn::fastMalloc(size);
      pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
      pPVar2 = this->d;
      local_30.first = size;
      goto LAB_00147945;
    }
    p_Var1 = __position._M_node[1]._M_next;
  } while ((p_Var1 < size) || (size < (ulong)(uint)__mutex[2].__data.__lock * (long)p_Var1 >> 8));
  p_Var3 = __position._M_node[1]._M_prev;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            ((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              *)this_00,__position);
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  pPVar2 = this->d;
  local_30.first = (unsigned_long)p_Var1;
LAB_00147945:
  local_30.second = p_Var3;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&pPVar2->payouts,&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  return p_Var3;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}